

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O3

void brotli::HistogramRemap<brotli::Histogram<704>>
               (Histogram<704> *in,size_t in_size,Histogram<704> *out,uint32_t *symbols)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  Histogram<704> *pHVar8;
  pointer puVar9;
  long lVar10;
  size_t sVar11;
  double dVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> all_symbols;
  allocator_type local_61;
  uint *local_60;
  Histogram<704> *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  size_t local_38;
  
  local_58 = in;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_50,symbols,
             symbols + in_size,&local_61);
  puVar2 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar9 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar3 = (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar10 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar9,puVar2);
    puVar9 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar6 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      do {
        puVar4 = puVar6;
        if (puVar4 == local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish) goto LAB_00173775;
        puVar6 = puVar4 + 1;
      } while (puVar4[-1] != *puVar4);
      puVar5 = puVar4 + -1;
      uVar7 = puVar4[-1];
      for (; puVar6 != local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
        uVar1 = *puVar6;
        if (uVar7 != uVar1) {
          puVar5[1] = uVar1;
          puVar5 = puVar5 + 1;
        }
        uVar7 = uVar1;
      }
      puVar9 = puVar5 + 1;
    }
  }
LAB_00173775:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_50,
             (long)puVar9 -
             (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  puVar4 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = in_size;
  puVar9 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (in_size != 0) {
    sVar11 = 0;
    do {
      puVar6 = symbols + (sVar11 - 1);
      if (sVar11 == 0) {
        puVar6 = symbols;
      }
      uVar3 = (ulong)*puVar6;
      pHVar8 = local_58 + sVar11;
      local_60 = (uint *)HistogramBitCostDistance<brotli::Histogram<704>>(pHVar8,out + uVar3);
      for (puVar9 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          puVar9 != local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
        dVar12 = HistogramBitCostDistance<brotli::Histogram<704>>(pHVar8,out + *puVar9);
        if (dVar12 < (double)local_60) {
          uVar3 = (ulong)*puVar9;
          local_60 = (uint *)dVar12;
        }
      }
      symbols[sVar11] = (uint32_t)uVar3;
      sVar11 = sVar11 + 1;
      puVar4 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (sVar11 != local_38);
  }
  for (; local_60 = puVar4, puVar6 != puVar9; puVar6 = puVar6 + 1) {
    uVar7 = *puVar6;
    memset(out + uVar7,0,0xb08);
    out[uVar7].bit_cost_ = INFINITY;
    puVar4 = local_60;
  }
  if (local_38 != 0) {
    sVar11 = 0;
    pHVar8 = local_58;
    do {
      uVar7 = symbols[sVar11];
      out[uVar7].total_count_ = out[uVar7].total_count_ + local_58[sVar11].total_count_;
      lVar10 = 0;
      do {
        out[uVar7].data_[lVar10] = out[uVar7].data_[lVar10] + pHVar8->data_[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x2c0);
      sVar11 = sVar11 + 1;
      pHVar8 = pHVar8 + 1;
    } while (sVar11 != local_38);
  }
  if (local_60 != (uint *)0x0) {
    operator_delete(local_60,(long)local_50.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_60);
  }
  return;
}

Assistant:

void HistogramRemap(const HistogramType* in, size_t in_size,
                    HistogramType* out, uint32_t* symbols) {
  // Uniquify the list of symbols.
  std::vector<uint32_t> all_symbols(symbols, symbols + in_size);
  std::sort(all_symbols.begin(), all_symbols.end());
  std::vector<uint32_t>::iterator last =
      std::unique(all_symbols.begin(), all_symbols.end());
  all_symbols.resize(static_cast<size_t>(last - all_symbols.begin()));

  for (size_t i = 0; i < in_size; ++i) {
    uint32_t best_out = i == 0 ? symbols[0] : symbols[i - 1];
    double best_bits = HistogramBitCostDistance(in[i], out[best_out]);
    for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
         k != all_symbols.end(); ++k) {
      const double cur_bits = HistogramBitCostDistance(in[i], out[*k]);
      if (cur_bits < best_bits) {
        best_bits = cur_bits;
        best_out = *k;
      }
    }
    symbols[i] = best_out;
  }


  // Recompute each out based on raw and symbols.
  for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
       k != all_symbols.end(); ++k) {
    out[*k].Clear();
  }
  for (size_t i = 0; i < in_size; ++i) {
    out[symbols[i]].AddHistogram(in[i]);
  }
}